

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

var cs::range(vector *args)

{
  numeric *args_00;
  string *str;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  numeric *in_RDI;
  vector *in_stack_00000010;
  runtime_error *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  numeric *args_1;
  unsigned_long in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  args_1 = in_RDI;
  args_00 = (numeric *)std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RSI);
  if (args_00 == (numeric *)0x1) {
    cs_impl::check_args<cs::numeric>(in_stack_00000010);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    cs_impl::any::make_constant<cs::range_type,int,cs::numeric_const&,int>
              ((int *)args_00,args_1,(int *)in_RDI);
  }
  else if (args_00 == (numeric *)0x2) {
    cs_impl::check_args<cs::numeric,cs::numeric>(in_stack_00000010);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,1);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    cs_impl::any::make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,int>
              (args_00,args_1,(int *)in_RDI);
  }
  else {
    if (args_00 != (numeric *)0x3) {
      str = (string *)__cxa_allocate_exception(0x28);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RSI);
      std::__cxx11::to_string(in_stack_ffffffffffffff98);
      std::operator+(in_stack_ffffffffffffff68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff60);
      runtime_error::runtime_error(in_stack_ffffffffffffff60,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    cs_impl::check_args<cs::numeric,cs::numeric,cs::numeric>(in_stack_00000010);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,1);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,2);
    cs_impl::any::const_val<cs::numeric>
              ((any *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    cs_impl::any::
    make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
              (args_00,args_1,in_RDI);
  }
  return (var)(proxy *)args_1;
}

Assistant:

var range(vector &args)
	{
		switch (args.size()) {
		case 1:
			cs_impl::check_args<numeric>(args);
			return var::make_constant<range_type>(0, args[0].const_val<numeric>(), 1);
		case 2:
			cs_impl::check_args<numeric, numeric>(args);
			return var::make_constant<range_type>(args[0].const_val<numeric>(), args[1].const_val<numeric>(), 1);
		case 3:
			cs_impl::check_args<numeric, numeric, numeric>(args);
			return var::make_constant<range_type>(args[0].const_val<numeric>(), args[1].const_val<numeric>(),
			                                      args[2].const_val<numeric>());
		default:
			throw cs::runtime_error(
			    "Wrong size of the arguments. Expected 1, 2 or 3, provided " + std::to_string(args.size()));
		}
	}